

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O2

void __thiscall
sqlcheck::TestSuite_ForeignKeyExistsTest_Test::~TestSuite_ForeignKeyExistsTest_Test
          (TestSuite_ForeignKeyExistsTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(TestSuite, ForeignKeyExistsTest) {

  Configuration default_conf;
  default_conf.testing_mode = true;
  default_conf.verbose = false;

  std::unique_ptr<std::istringstream> stream(new std::istringstream());
  stream->str(

      "CREATE TABLE BugsProducts ("
      "id SERIAL PRIMARY KEY,"
      "bug_id      BIGINT UNSIGNED NOT NULL,"
      "product_id  BIGINT UNSIGNED NOT NULL,"
      "UNIQUE KEY (bug_id, product_id));\n"

  );

  default_conf.test_stream.reset(stream.release());

  Check(default_conf);

}